

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.h
# Opt level: O3

string * __thiscall
RelPathEnv::ApplyChdir(string *__return_storage_ptr__,RelPathEnv *this,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  long lVar6;
  string a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar2 = s->_M_string_length;
  if ((sVar2 == 0) || (pcVar3 = (s->_M_dataplus)._M_p, *pcVar3 != '/')) {
    pcVar4 = (this->abs_path_)._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar4,pcVar4 + (this->abs_path_)._M_string_length);
    if (local_40._M_string_length != 0) {
      do {
        if ((s->_M_string_length < 4) || (pcVar3 = (s->_M_dataplus)._M_p, *pcVar3 != '.')) break;
        if (pcVar3[1] == '.') {
          if (pcVar3[2] == '/') {
            lVar6 = std::__cxx11::string::rfind((char)&local_40,0x2f);
            if (lVar6 == -1) {
              local_40._M_string_length = 0;
              *local_40._M_dataplus._M_p = '\0';
            }
            else {
              std::__cxx11::string::erase((ulong)&local_40,lVar6 + 1);
            }
            std::__cxx11::string::erase((ulong)s,0);
          }
        }
        else if (pcVar3[1] == '/') {
          std::__cxx11::string::erase((ulong)s,0);
        }
      } while (local_40._M_string_length != 0);
    }
    std::operator+(__return_storage_ptr__,&local_40,s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &s->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar5 = *(undefined8 *)((long)&s->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = sVar2;
    (s->_M_dataplus)._M_p = (pointer)paVar1;
    s->_M_string_length = 0;
    (s->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

string ApplyChdir(string s) const {
    if (s.size() > 0 && s[0] == '/') {
      return s;
    }
    // Optimization: only simplify ./ and ../ on boundary between a and s.
    // To process all ./ and ../, wrap the following code in a loop. At the end
    // of the loop, search for ./ or ../ and construct new a and s using that as
    // the new boundary.
    //
    // Note: there are dangerous filesystem bugs in assuming that ../ can be
    // simplified in this way. It only "works" when the dir before ../ in the
    // relative path is a physical directory entry (so, no symlinks, FS joins,
    // or other filesystem features).
    string a = AsString();
    while (!a.empty() && s.size() > 3 &&
        s[0] == '.') {
      if (s[1] == '/') {
        s.erase(0, 2);  // Remove "./" from s.
      } else if (s[1] == '.' && s[2] == '/') {
        string::size_type i = a.rfind('/', a.size() - 2);
        if (i == string::npos) {
          a.clear();
        } else {
          i++;
          a.erase(i, a.size() - i);  // Remove "../" from s and one dir from a.
        }
        s.erase(0, 3);
      }
    }
    return a + s;
  }